

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

bool si9ma::BinaryTree::is_complete_binary_tree(TreeNode *head)

{
  TreeNode *pTVar1;
  value_type in_RDI;
  bool bVar2;
  bool bVar3;
  queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
  node_queue;
  value_type local_78;
  _Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> local_70;
  
  if (in_RDI == (value_type)0x0) {
    bVar3 = true;
  }
  else {
    local_78 = in_RDI;
    std::
    queue<si9ma::TreeNode_const*,std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>>
    ::queue<std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>,void>
              ((queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                *)&local_70);
    std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::push_back
              ((deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> *)&local_70
               ,&local_78);
    bVar2 = false;
LAB_00109535:
    do {
      bVar3 = local_70._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_70._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (bVar3) break;
      local_78 = *local_70._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::pop_front
                ((deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> *)
                 &local_70);
      if (bVar2) {
        if ((local_78->left != (TreeNode *)0x0) || (local_78->right != (TreeNode *)0x0)) break;
      }
      else if (local_78->left != (TreeNode *)0x0) {
        pTVar1 = local_78->right;
        std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::push_back
                  ((deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> *)
                   &local_70,&local_78->left);
        bVar2 = (bool)(bVar2 | pTVar1 == (TreeNode *)0x0);
        if (local_78->right != (TreeNode *)0x0) {
          std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::push_back
                    ((deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> *)
                     &local_70,&local_78->right);
        }
        goto LAB_00109535;
      }
      bVar2 = true;
    } while (local_78->right == (TreeNode *)0x0);
    std::_Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::
    ~_Deque_base(&local_70);
  }
  return bVar3;
}

Assistant:

bool BinaryTree::is_complete_binary_tree(const si9ma::TreeNode *head) {
        if (head == nullptr)
            return true;

        bool leaf = false;
        queue<const TreeNode *> node_queue;
        node_queue.push(head);
        while (!node_queue.empty()){
            head = node_queue.front();
            node_queue.pop();

            if ((leaf && (head->left != nullptr || head->right != nullptr))
                 || (head->left == nullptr && head->right != nullptr))
                return false;

            if (head->left == nullptr || head->right == nullptr)
                leaf = true;

            if (head->left != nullptr)
                node_queue.push(head->left);

            if (head->right != nullptr)
                node_queue.push(head->right);
        }

        return true;
    }